

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_array.cc
# Opt level: O3

string * __thiscall
ArrayType::GenArrayInit_abi_cxx11_
          (string *__return_storage_ptr__,ArrayType *this,Output *out_cc,Env *env,
          bool known_array_length)

{
  pointer pcVar1;
  char *pcVar2;
  ID *pIVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (this->super_Type).lvalue_._M_dataplus._M_p;
  strlen(pcVar2);
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar2);
  if ((this->super_Type).incremental_parsing_ == true) {
    if (this->elem_it_var_field_ == (Field *)0x0) {
      pIVar3 = (ID *)0x0;
    }
    else {
      pIVar3 = this->elem_it_var_field_->id_;
    }
    pcVar2 = Env::LValue(env,pIVar3);
    Output::println(out_cc,"if ( %s < 0 )",pcVar2);
    out_cc->indent_ = out_cc->indent_ + 1;
    Output::println(out_cc,"{");
    Output::println(out_cc,"// Initialize only once");
    if (this->elem_it_var_field_ == (Field *)0x0) {
      pIVar3 = (ID *)0x0;
    }
    else {
      pIVar3 = this->elem_it_var_field_->id_;
    }
    pcVar2 = Env::LValue(env,pIVar3);
    Output::println(out_cc,"%s = 0;",pcVar2);
  }
  Output::println(out_cc,"%s = new %s;",(this->super_Type).lvalue_._M_dataplus._M_p,
                  (this->vector_str_)._M_dataplus._M_p);
  if (known_array_length) {
    if (this->arraylength_var_field_ == (Field *)0x0) {
      pIVar3 = (ID *)0x0;
    }
    else {
      pIVar3 = this->arraylength_var_field_->id_;
    }
    pcVar1 = (this->super_Type).lvalue_._M_dataplus._M_p;
    pcVar2 = Env::RValue(env,pIVar3);
    Output::println(out_cc,"%s->reserve(%s);",pcVar1,pcVar2);
  }
  if ((this->super_Type).incremental_parsing_ == true) {
    Output::println(out_cc,"}");
    out_cc->indent_ = out_cc->indent_ + -1;
  }
  return __return_storage_ptr__;
}

Assistant:

string ArrayType::GenArrayInit(Output* out_cc, Env* env, bool known_array_length)
	{
	string array_str;

	array_str = lvalue();
	if ( incremental_parsing() )
		{
		out_cc->println("if ( %s < 0 )", env->LValue(elem_it_var()));
		out_cc->inc_indent();
		out_cc->println("{");
		out_cc->println("// Initialize only once");
		out_cc->println("%s = 0;", env->LValue(elem_it_var()));
		}

	out_cc->println("%s = new %s;", lvalue(), vector_str_.c_str());

	if ( known_array_length )
		{
		out_cc->println("%s->reserve(%s);", lvalue(), env->RValue(arraylength_var()));
		}

	if ( incremental_parsing() )
		{
		out_cc->println("}");
		out_cc->dec_indent();
		}

	return array_str;
	}